

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeGenericDeclarations
          (StringTree *__return_storage_ptr__,CapnpcCppMain *this,TemplateContext *templateContext,
          bool hasBrandDependencies)

{
  char *params_4;
  StringTree local_50;
  
  params_4 = "";
  if ((int)templateContext != 0) {
    params_4 = "    static const ::capnp::_::RawBrandedSchema::Dependency brandDependencies[];\n";
  }
  TemplateContext::allArgs(&local_50,(TemplateContext *)this);
  kj::strTree<char_const(&)[141],char_const*,char_const(&)[175],kj::StringTree,char_const(&)[15]>
            (__return_storage_ptr__,
             (kj *)
             "    static const ::capnp::_::RawBrandedSchema::Scope brandScopes[];\n    static const ::capnp::_::RawBrandedSchema::Binding brandBindings[];\n"
             ,(char (*) [141])&stack0xffffffffffffffa8,
             (char **)
             "    static const ::capnp::_::RawBrandedSchema specificBrand;\n    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return ::capnp::_::ChooseBrand<_capnpPrivate, "
             ,(char (*) [175])&local_50,(StringTree *)">::brand(); }\n",(char (*) [15])params_4);
  kj::StringTree::~StringTree(&local_50);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree makeGenericDeclarations(const TemplateContext& templateContext,
                                         bool hasBrandDependencies) {
    // Returns the declarations for the private members of a generic struct/interface;
    // paired with the definitions from makeGenericDefinitions().
    return kj::strTree(
        "    static const ::capnp::_::RawBrandedSchema::Scope brandScopes[];\n"
        "    static const ::capnp::_::RawBrandedSchema::Binding brandBindings[];\n",
        (!hasBrandDependencies ? "" :
            "    static const ::capnp::_::RawBrandedSchema::Dependency brandDependencies[];\n"),
        "    static const ::capnp::_::RawBrandedSchema specificBrand;\n"
        "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { "
        "return ::capnp::_::ChooseBrand<_capnpPrivate, ", templateContext.allArgs(), ">::brand(); }\n");
  }